

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.h
# Opt level: O3

void __thiscall
embree::sse2::BVHNRefitT<4,embree::TriangleMesh,embree::TriangleMi<4>>::leafBounds
          (BVHNRefitT<4,embree::TriangleMesh,embree::TriangleMi<4>> *this)

{
  NodeRef *in_RDX;
  long in_RSI;
  
  BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::leafBounds
            ((BBox3fa *)this,
             (BVHNRefitT<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *)(in_RSI + -0x10),in_RDX)
  ;
  return;
}

Assistant:

virtual const BBox3fa leafBounds (NodeRef& ref) const
      {
        size_t num; char* prim = ref.leaf(num);
        if (unlikely(ref == BVH::emptyNode)) return empty;

        BBox3fa bounds = empty;
        for (size_t i=0; i<num; i++)
            bounds.extend(((Primitive*)prim)[i].update(mesh));
        return bounds;
      }